

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O1

scalar_function_t * __thiscall
duckdb::UDFWrapper::CreateScalarFunction<duckdb::date_t,duckdb::date_t,duckdb::date_t>
          (scalar_function_t *__return_storage_ptr__,UDFWrapper *this,string *name,
          vector<duckdb::LogicalType,_true> *args,LogicalType *ret_type,
          _func_date_t_date_t_date_t *udf_func)

{
  byte bVar1;
  runtime_error *this_00;
  
  bVar1 = *(byte *)&(args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  if (bVar1 == 0xf) {
    if (name->_M_string_length - (long)(name->_M_dataplus)._M_p == 0x30) {
      CreateBinaryFunction<duckdb::date_t,duckdb::date_t,duckdb::date_t>
                (__return_storage_ptr__,this,name,args,ret_type,udf_func);
      return __return_storage_ptr__;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "The number of templated types should be the same quantity of the LogicalType arguments."
              );
  }
  else if ((bVar1 < 0x23) && ((0x507df7c00U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Return type doesn\'t match with the first template type.");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Type is not supported!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline static scalar_function_t CreateBinaryFunction(const string &name, const vector<LogicalType> &args,
	                                                     const LogicalType &ret_type,
	                                                     TR (*udf_func)(ARGS...)) { // LCOV_EXCL_START
		throw std::runtime_error("Incorrect number of arguments for binary function");
	}